

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

ACT_TYPE __thiscall
despot::TagSHRPolicy::Action
          (TagSHRPolicy *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  Floor *pFVar1;
  OBS_TYPE OVar2;
  char cVar3;
  ACT_TYPE AVar4;
  int iVar5;
  undefined8 uVar6;
  int local_5c;
  vector<int,_std::allocator<int>_> actions;
  Coord rob;
  
  if (*(long *)(history + 8) == *(long *)history) {
    (**(code **)(*(long *)this->tag_model_ + 0x18))();
    AVar4 = despot::Random::NextInt(0x123168);
    return AVar4;
  }
  if (*(OBS_TYPE *)(*(long *)(history + 0x20) + -8) == this->tag_model_->same_loc_obs_) {
    AVar4 = 4;
  }
  else {
    actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    despot::Coord::Coord(&rob);
    OVar2 = this->tag_model_->same_loc_obs_;
    pFVar1 = &this->floor_;
    iVar5 = despot::Floor::NumCells();
    if (OVar2 == (long)iVar5) {
      _rob = despot::Floor::GetCell((int)pFVar1);
    }
    else {
      _rob = BaseTag::MostLikelyRobPosition(this->tag_model_,particles);
    }
    for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
      cVar3 = despot::Compass::Opposite(local_5c,*(int *)(*(long *)(history + 8) + -4));
      if (cVar3 == '\0') {
        uVar6 = despot::operator+(&rob,(Coord *)(&Compass::DIRECTIONS + local_5c));
        cVar3 = despot::Floor::Inside(pFVar1,uVar6);
        if (cVar3 != '\0') {
          std::vector<int,_std::allocator<int>_>::push_back(&actions,&local_5c);
        }
      }
    }
    if (actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
        uVar6 = despot::operator+(&rob,(Coord *)(&Compass::DIRECTIONS + local_5c));
        cVar3 = despot::Floor::Inside(pFVar1,uVar6);
        if (cVar3 != '\0') {
          std::vector<int,_std::allocator<int>_>::push_back(&actions,&local_5c);
        }
      }
    }
    if (actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      AVar4 = 0;
    }
    else {
      iVar5 = despot::Random::NextInt(0x123168);
      AVar4 = actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[iVar5];
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&actions.super__Vector_base<int,_std::allocator<int>_>);
  }
  return AVar4;
}

Assistant:

ACT_TYPE Action(const vector<State*>& particles, RandomStreams& streams,
		History& history) const {
		// If history is empty then take a random move
		if (history.Size() == 0) {
			return Random::RANDOM.NextInt(tag_model_->NumActions() - 1);
		}

		// If we just saw an opponent then TAG
		if (history.LastObservation() == tag_model_->same_loc_obs_) {
			return tag_model_->TagAction();
		}

		vector<ACT_TYPE> actions;
		// Compute rob position
		Coord rob;
		if (tag_model_->same_loc_obs_ != floor_.NumCells()) {
			rob = tag_model_->MostLikelyRobPosition(particles);
		} else {
			rob = floor_.GetCell(history.LastObservation());
		}

		// Don't double back and don't go into walls
		for (int d = 0; d < 4; d++) {
			if (!Compass::Opposite(d, history.LastAction())
				&& floor_.Inside(rob + Compass::DIRECTIONS[d])) {
				actions.push_back(d);
			}
		}

		// Have to double back
		if (actions.size() == 0) {
			for (int d = 0; d < 4; d++) {
				if (floor_.Inside(rob + Compass::DIRECTIONS[d]))
					actions.push_back(d);
			}
		}

		// Rob may be trapped by the obstacles
		if (actions.size() == 0)
			return 0;

		ACT_TYPE action = actions[Random::RANDOM.NextInt(actions.size())];
		return action;
	}